

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O3

void __thiscall Cmd::cmdLoop(Cmd *this)

{
  byte bVar1;
  bool bVar2;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> line;
  string local_50;
  byte local_30;
  
  do {
    bVar2 = false;
    nextLine_abi_cxx11_((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_50,this,false);
    bVar1 = local_30;
    if (local_30 == 1) {
      bVar2 = oneCmd(this,&local_50);
    }
    if ((local_30 & 1) != 0) {
      local_30 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  } while (bVar2 == false && bVar1 == 1);
  return;
}

Assistant:

void cmdLoop() {
		bool stop = false;
		while (!stop) {
			std::optional<std::string> line = nextLine();
			if (!line) {
				break;
			}
			stop = oneCmd(*line);
		}
	}